

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNameTreeObjectHelper.cc
# Opt level: O0

bool __thiscall QPDFNameTreeObjectHelper::hasName(QPDFNameTreeObjectHelper *this,string *name)

{
  bool bVar1;
  iterator local_a8;
  undefined1 local_60 [8];
  iterator i;
  string *name_local;
  QPDFNameTreeObjectHelper *this_local;
  
  i.ivalue.second.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)name;
  find((iterator *)local_60,this,name,false);
  end(&local_a8,this);
  bVar1 = iterator::operator!=((iterator *)local_60,&local_a8);
  iterator::~iterator(&local_a8);
  iterator::~iterator((iterator *)local_60);
  return bVar1;
}

Assistant:

bool
QPDFNameTreeObjectHelper::hasName(std::string const& name)
{
    auto i = find(name);
    return (i != end());
}